

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

void __thiscall
banksia::ChessBoard::genLegalOnly
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          Side attackerSide)

{
  pointer pMVar1;
  undefined8 uVar2;
  int iVar3;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *__range1;
  MoveFull *move;
  pointer __args;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moves;
  Hist hist;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> local_d8;
  undefined1 local_c0 [56];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  (*(this->super_BoardCore).super_Obj._vptr_Obj[0x11])();
  local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (MoveFull *)0x0;
  local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>._M_impl.
  super__Vector_impl_data._M_finish = (MoveFull *)0x0;
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  __args = (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != pMVar1) {
    do {
      (*(this->super_BoardCore).super_Obj._vptr_Obj[0x15])(this,__args,local_c0);
      iVar3 = (*(this->super_BoardCore).super_Obj._vptr_Obj[0x13])(this,(ulong)attackerSide);
      if ((char)iVar3 == '\0') {
        if (local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<banksia::MoveFull,std::allocator<banksia::MoveFull>>::
          _M_realloc_insert<banksia::MoveFull_const&>
                    ((vector<banksia::MoveFull,std::allocator<banksia::MoveFull>> *)&local_d8,
                     (iterator)
                     local_d8.
                     super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
                     _M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          ((local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
            _M_impl.super__Vector_impl_data._M_finish)->piece).side = (__args->piece).side;
          iVar3 = (__args->super_Move).dest;
          uVar2 = *(undefined8 *)&(__args->super_Move).promotion;
          ((local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_Move).from = (__args->super_Move).from
          ;
          ((local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_Move).dest = iVar3;
          *(undefined8 *)
           &((local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
              _M_impl.super__Vector_impl_data._M_finish)->super_Move).promotion = uVar2;
          local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      (*(this->super_BoardCore).super_Obj._vptr_Obj[0x16])(this,local_c0);
      __args = __args + 1;
    } while (__args != pMVar1);
  }
  std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::operator=(moveList,&local_d8);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_d8.super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChessBoard::genLegalOnly(std::vector<MoveFull>& moveList, Side attackerSide) {
    gen(moveList, attackerSide);
    
    std::vector<MoveFull> moves;
    Hist hist;
    for (auto && move : moveList) {
        make(move, hist);
        if (!isIncheck(attackerSide)) {
            moves.push_back(move);
        }
        takeBack(hist);
    }
    moveList = moves;
}